

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Subtract
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  undefined4 in_register_00000014;
  uchar *puVar5;
  uchar *puVar6;
  undefined4 in_register_0000008c;
  ulong uVar7;
  uchar uVar8;
  uchar *puVar9;
  uchar *puVar10;
  uint local_9c;
  undefined8 local_98;
  Image *local_90;
  undefined8 local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_88 = CONCAT44(in_register_0000008c,startY2);
  local_98 = CONCAT44(in_register_00000014,startY1);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  local_90 = in2;
  bVar4 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2,out);
  local_9c = width * bVar4;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,in1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_9c,&height,in1,&local_58,&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  uVar1 = in1->_rowSize;
  uVar2 = out->_rowSize;
  uVar3 = local_90->_rowSize;
  puVar10 = in1->_data + (ulong)(startX1 * bVar4) + (ulong)((int)local_98 * uVar1);
  puVar5 = local_90->_data + (ulong)(startX2 * bVar4) + (ulong)((int)local_88 * uVar3);
  puVar9 = out->_data + (ulong)(startXOut * bVar4) + (ulong)(startYOut * uVar2);
  puVar6 = puVar9 + height * uVar2;
  for (; puVar9 != puVar6; puVar9 = puVar9 + uVar2) {
    for (uVar7 = 0; local_9c != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = puVar10[uVar7] - puVar5[uVar7];
      if (puVar10[uVar7] < puVar5[uVar7]) {
        uVar8 = '\0';
      }
      puVar9[uVar7] = uVar8;
    }
    puVar10 = puVar10 + uVar1;
    puVar5 = puVar5 + uVar3;
  }
  return;
}

Assistant:

void Subtract( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in1, in2, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in1, out );

        const uint32_t rowSize1   = in1.rowSize();
        const uint32_t rowSize2   = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSize1   + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSize2   + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? 0u : (*in1X) - (*in2X) );
        }
    }